

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_mathlib.cpp
# Opt level: O0

int __thiscall astc::rand(astc *this)

{
  ulong val;
  ulong uVar1;
  ulong val_00;
  uint64_t uVar2;
  uint64_t res;
  uint64_t s1;
  uint64_t s0;
  
  val = *(ulong *)this;
  uVar1 = *(ulong *)(this + 8);
  val_00 = val ^ uVar1;
  uVar2 = rotl(val,0x18);
  *(uint64_t *)this = uVar2 ^ val_00 ^ val_00 << 0x10;
  uVar2 = rotl(val_00,0x25);
  *(uint64_t *)(this + 8) = uVar2;
  return (int)val + (int)uVar1;
}

Assistant:

uint64_t astc::rand(uint64_t state[2])
{
	uint64_t s0 = state[0];
	uint64_t s1 = state[1];
	uint64_t res = s0 + s1;
	s1 ^= s0;
	state[0] = rotl(s0, 24) ^ s1 ^ (s1 << 16);
	state[1] = rotl(s1, 37);
	return res;
}